

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlFAParseQuantExact(xmlRegParserCtxtPtr ctxt)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  byte *pbVar4;
  int iVar5;
  
  pbVar4 = ctxt->cur;
  bVar1 = *pbVar4;
  iVar5 = -1;
  if (0xf5 < (byte)(bVar1 - 0x3a)) {
    bVar3 = false;
    iVar5 = 0;
    do {
      pbVar4 = pbVar4 + 1;
      if (iVar5 < 0xccccccd) {
        iVar2 = bVar1 - 0x30;
        if ((int)(-0x7fffffd1 - (uint)bVar1) < iVar5 * 10) {
          bVar3 = true;
          iVar2 = 0;
        }
        iVar5 = iVar2 + iVar5 * 10;
      }
      else {
        bVar3 = true;
      }
      ctxt->cur = pbVar4;
      bVar1 = *pbVar4;
    } while ((byte)(bVar1 - 0x30) < 10);
    if (bVar3) {
      iVar5 = -1;
    }
  }
  return iVar5;
}

Assistant:

static int
xmlFAParseQuantExact(xmlRegParserCtxtPtr ctxt) {
    int ret = 0;
    int ok = 0;
    int overflow = 0;

    while ((CUR >= '0') && (CUR <= '9')) {
        if (ret > INT_MAX / 10) {
            overflow = 1;
        } else {
            int digit = CUR - '0';

            ret *= 10;
            if (ret > INT_MAX - digit)
                overflow = 1;
            else
                ret += digit;
        }
	ok = 1;
	NEXT;
    }
    if ((ok != 1) || (overflow == 1)) {
	return(-1);
    }
    return(ret);
}